

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O3

Regexp * __thiscall duckdb_re2::Regexp::ParseState::FinishRegexp(ParseState *this,Regexp *re)

{
  CharClassBuilder *this_00;
  CharClass *pCVar1;
  CharClassBuilder *ccb;
  
  if (((re != (Regexp *)0x0) && (re->down_ = (Regexp *)0x0, re->op_ == '\x14')) &&
     (this_00 = (re->arguments).char_class.ccb_, this_00 != (CharClassBuilder *)0x0)) {
    (re->arguments).capture.name_ = (string *)0x0;
    pCVar1 = CharClassBuilder::GetCharClass(this_00);
    (re->arguments).char_class.cc_ = pCVar1;
    std::
    _Rb_tree<duckdb_re2::RuneRange,_duckdb_re2::RuneRange,_std::_Identity<duckdb_re2::RuneRange>,_duckdb_re2::RuneRangeLess,_std::allocator<duckdb_re2::RuneRange>_>
    ::~_Rb_tree(&(this_00->ranges_)._M_t);
    operator_delete(this_00);
  }
  return re;
}

Assistant:

Regexp* Regexp::ParseState::FinishRegexp(Regexp* re) {
  if (re == NULL)
    return NULL;
  re->down_ = NULL;

  if (re->op_ == kRegexpCharClass && re->arguments.char_class.ccb_ != NULL) {
    CharClassBuilder* ccb = re->arguments.char_class.ccb_;
    re->arguments.char_class.ccb_ = NULL;
    re->arguments.char_class.cc_ = ccb->GetCharClass();
    delete ccb;
  }

  return re;
}